

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

void am_script_select_members_proc(Am_Object *cmd)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *value;
  Am_Object script_execute_command;
  Am_Object script_window;
  Am_Object undo_db;
  Am_Value_List original_command_list;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value_List local_18;
  
  Am_Object::Get_Object((Am_Object *)&local_18,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_30,(Am_Slot_Flags)&local_18);
  Am_Object::~Am_Object((Am_Object *)&local_18);
  pAVar2 = Am_Object::Get(&local_30,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&AStack_38,pAVar2);
  Am_Value_List::Am_Value_List(&local_18);
  bVar1 = Am_Object::Valid(&AStack_38);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&AStack_38,Am_ORIGINAL_COMMAND_LIST,0);
    Am_Value_List::operator=(&local_18,pAVar2);
    pAVar2 = Am_Object::Get(&local_30,Am_UNDO_MENU_OF_COMMANDS,0);
    Am_Object::Am_Object(&local_20,pAVar2);
    Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_20,(ulong)Am_UNDO_SCROLL_GROUP);
    value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_18);
    Am_Object::Set(&local_28,0x169,value,0);
    Am_Object::~Am_Object(&local_28);
    Am_Object::~Am_Object(&local_20);
    Am_Value_List::~Am_Value_List(&local_18);
    Am_Object::~Am_Object(&AStack_38);
    Am_Object::~Am_Object(&local_30);
    return;
  }
  Am_Error("where did execute command go");
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_script_select_members,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object script_execute_command =
      script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List original_command_list;
  if (script_execute_command.Valid())
    original_command_list =
        script_execute_command.Get(Am_ORIGINAL_COMMAND_LIST);
  else
    Am_Error("where did execute command go");
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  undo_db.Get_Object(Am_UNDO_SCROLL_GROUP).Set(Am_VALUE, original_command_list);
}